

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O2

void __thiscall Buffer::prepend(Buffer *this,byte *data,usize size)

{
  EVP_PKEY_CTX *pEVar1;
  byte *pbVar2;
  byte *src;
  Memory *this_00;
  EVP_PKEY_CTX *src_00;
  
  pbVar2 = this->buffer;
  src = this->bufferStart;
  if ((ulong)((long)src - (long)pbVar2) < size || pbVar2 == (byte *)0x0) {
    src_00 = (EVP_PKEY_CTX *)(this->bufferEnd + -(long)src);
    pEVar1 = src_00 + size;
    if ((pbVar2 == (byte *)0x0) || ((EVP_PKEY_CTX *)this->_capacity < pEVar1)) {
      this->_capacity = (usize)pEVar1;
      this_00 = (Memory *)operator_new__((ulong)(pEVar1 + 1));
      Memory::copy(this_00,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
      Memory::copy(this_00 + size,(EVP_PKEY_CTX *)this->bufferStart,src_00);
      if (this->buffer != (byte *)0x0) {
        operator_delete__(this->buffer);
      }
      this->buffer = (byte *)this_00;
    }
    else {
      Memory::move(pbVar2 + size,src,(usize)src_00);
      Memory::copy((Memory *)this->buffer,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
      this_00 = (Memory *)this->buffer;
    }
    this->bufferStart = (byte *)this_00;
    this->bufferEnd = (byte *)(pEVar1 + (long)this_00);
    return;
  }
  this->bufferStart = src + -size;
  Memory::copy((Memory *)(src + -size),(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
  return;
}

Assistant:

void prepend(const byte* data, usize size)
  {
    if(buffer && (usize)(bufferStart - buffer) >= size)
    {
      bufferStart -= size;
      Memory::copy(bufferStart, data, size);
      return;
    }
    usize oldSize = bufferEnd - bufferStart;
    usize requiredCapacity = size + oldSize;
    if(buffer && _capacity >= requiredCapacity)
    {
      Memory::move(buffer + size, bufferStart, oldSize);
      Memory::copy(buffer, data, size);
      bufferStart = buffer;
      bufferEnd = buffer + requiredCapacity;
    }
    else
    {
        _capacity = requiredCapacity;
      byte* newBuffer = (byte*)new char[requiredCapacity + 1];
      Memory::copy(newBuffer, data, size);
      Memory::copy(newBuffer + size, bufferStart, oldSize);
      delete [] (char*)buffer;
      bufferStart = buffer = newBuffer;
      bufferEnd = newBuffer+ requiredCapacity;
    }
  }